

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O1

Params * adios2::helper::BuildParametersMap
                   (Params *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *parameters,char delimKeyValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  undefined8 *puVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  undefined8 uVar9;
  long *plVar10;
  size_type *psVar11;
  undefined7 in_register_00000011;
  pointer __rhs;
  string field;
  string value;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  string local_118;
  uint local_f4;
  long *local_f0;
  ulong local_e8;
  long local_e0;
  long lStack_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_d0;
  key_type local_c8;
  undefined1 *local_a8;
  ulong local_a0;
  undefined1 local_98 [20];
  undefined4 local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pointer local_40;
  _Base_ptr local_38;
  
  local_84 = (undefined4)CONCAT71(in_register_00000011,delimKeyValue);
  local_38 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = local_38;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = local_38;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __rhs = (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = &__return_storage_ptr__->_M_t;
  if (__rhs != local_40) {
    paVar1 = &local_138.field_2;
    do {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_a8 = local_98;
      local_a0 = 0;
      local_98[0] = 0;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      pcVar2 = (__rhs->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar2,pcVar2 + __rhs->_M_string_length);
      local_f4 = (uint)(char)local_84;
      lVar3 = std::__cxx11::string::find((char)&local_80,(ulong)local_f4);
      if (lVar3 == -1) {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        local_198.field_2._M_allocated_capacity._4_2_ = 0x7265;
        local_198.field_2._M_allocated_capacity._0_4_ = 0x706c6548;
        local_198._M_string_length = 6;
        local_198.field_2._M_local_buf[6] = '\0';
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        local_118.field_2._M_allocated_capacity._0_7_ = 0x7453736f696461;
        local_118.field_2._7_4_ = 0x676e6972;
        local_118._M_string_length = 0xb;
        local_118.field_2._M_local_buf[0xb] = '\0';
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        local_138._M_dataplus._M_p = (pointer)0x12;
        local_178._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_178,(ulong)&local_138);
        local_178.field_2._M_allocated_capacity = (size_type)local_138._M_dataplus._M_p;
        *(undefined8 *)local_178._M_dataplus._M_p = 0x726150646c697542;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p + 8) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p + 9) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p + 10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p + 0xb) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p + 0xc) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p + 0xd) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p + 0xe) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p + 0xf) = 'M';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p + 0x10) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p + 0x11) = 'p';
        local_178._M_string_length = (size_type)local_138._M_dataplus._M_p;
        local_178._M_dataplus._M_p[(long)local_138._M_dataplus._M_p] = '\0';
        std::operator+(&local_60,"wrong format for IO parameter ",&local_80);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_f0 = &local_e0;
        plVar10 = plVar4 + 2;
        if ((long *)*plVar4 == plVar10) {
          local_e0 = *plVar10;
          lStack_d8 = plVar4[3];
        }
        else {
          local_e0 = *plVar10;
          local_f0 = (long *)*plVar4;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)plVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_f0,local_e8,0,'\x01');
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        psVar11 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_158.field_2._M_allocated_capacity = *psVar11;
          local_158.field_2._8_8_ = plVar4[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar11;
          local_158._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_158._M_string_length = plVar4[1];
        *plVar4 = (long)psVar11;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
        psVar11 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_138.field_2._M_allocated_capacity = *psVar11;
          local_138.field_2._8_8_ = plVar4[3];
          local_138._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar11;
          local_138._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_138._M_string_length = plVar4[1];
        *plVar4 = (long)psVar11;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        Throw<std::invalid_argument>(&local_198,&local_118,&local_178,&local_138,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::substr((ulong)&local_198,(ulong)&local_80);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      std::__cxx11::string::substr((ulong)&local_198,(ulong)&local_80);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::__cxx11::string::find_first_not_of((char *)&local_c8,0x752c2e,0);
      std::__cxx11::string::erase((ulong)&local_c8,0);
      lVar3 = std::__cxx11::string::find_last_not_of((char *)&local_c8,0x752c2e,0xffffffffffffffff);
      uVar5 = lVar3 + 1;
      if (local_c8._M_string_length < uVar5) {
LAB_004151c1:
        uVar9 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase",uVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_d0);
        _Unwind_Resume(uVar9);
      }
      local_c8._M_dataplus._M_p[uVar5] = '\0';
      local_c8._M_string_length = uVar5;
      std::__cxx11::string::find_first_not_of((char *)&local_a8,0x752c2e,0);
      std::__cxx11::string::erase((ulong)&local_a8,0);
      lVar3 = std::__cxx11::string::find_last_not_of((char *)&local_a8,0x752c2e,0xffffffffffffffff);
      uVar5 = lVar3 + 1;
      if (local_a0 < uVar5) goto LAB_004151c1;
      local_a8[uVar5] = 0;
      local_a0 = uVar5;
      if (uVar5 == 0) {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Helper","");
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"adiosString","");
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,"BuildParametersMap","");
        std::operator+(&local_60,"empty value in IO parameter ",__rhs);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_60);
        local_f0 = &local_e0;
        plVar4 = puVar6 + 2;
        if ((long *)*puVar6 == plVar4) {
          local_e0 = *plVar4;
          lStack_d8 = puVar6[3];
        }
        else {
          local_e0 = *plVar4;
          local_f0 = (long *)*puVar6;
        }
        local_e8 = puVar6[1];
        *puVar6 = plVar4;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_replace_aux((ulong)&local_f0,local_e8,0,'\x01');
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        psVar11 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_158.field_2._M_allocated_capacity = *psVar11;
          local_158.field_2._8_8_ = puVar6[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar11;
          local_158._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_158._M_string_length = puVar6[1];
        *puVar6 = psVar11;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
        psVar11 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_138.field_2._M_allocated_capacity = *psVar11;
          local_138.field_2._8_8_ = puVar6[3];
          local_138._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar11;
          local_138._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_138._M_string_length = puVar6[1];
        *puVar6 = psVar11;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        Throw<std::invalid_argument>(&local_198,&local_118,&local_178,&local_138,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
      }
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_d0,&local_c8);
      if (cVar7._M_node != local_38) {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Helper","");
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"adiosString","");
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,"BuildParametersMap","");
        std::operator+(&local_158,"parameter ",&local_c8);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
        psVar11 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_138.field_2._M_allocated_capacity = *psVar11;
          local_138.field_2._8_8_ = puVar6[3];
          local_138._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar11;
          local_138._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_138._M_string_length = puVar6[1];
        *puVar6 = psVar11;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        Throw<std::invalid_argument>(&local_198,&local_118,&local_178,&local_138,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
      }
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_d0,&local_c8);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      __rhs = __rhs + 1;
    } while (__rhs != local_40);
  }
  return (Params *)local_d0;
}

Assistant:

Params BuildParametersMap(const std::vector<std::string> &parameters, const char delimKeyValue)
{
    auto lf_Trim = [](std::string &input) {
        input.erase(0, input.find_first_not_of(" \n\r\t")); // prefixing spaces
        input.erase(input.find_last_not_of(" \n\r\t") + 1); // suffixing spaces
    };

    auto lf_GetFieldValue = [](const std::string parameter, std::string &field, std::string &value,
                               const char delimKeyValue) {
        auto equalPosition = parameter.find(delimKeyValue);

        if (equalPosition == parameter.npos)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "wrong format for IO parameter " + parameter +
                                                     ", format must be key" + delimKeyValue +
                                                     "value for each entry");
        }

        field = parameter.substr(0, equalPosition);
        value = parameter.substr(equalPosition + 1);
    };

    // BODY OF FUNCTION STARTS HERE
    Params parametersOutput;

    for (const std::string &parameter : parameters)
    {
        std::string field, value;
        lf_GetFieldValue(parameter, field, value, delimKeyValue);
        lf_Trim(field);
        lf_Trim(value);

        if (value.length() == 0)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "empty value in IO parameter " + parameter +
                                                     ", format must be key" + delimKeyValue +
                                                     "value");
        }
        if (parametersOutput.count(field) == 1)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "parameter " + field +
                                                     " already exists, must be unique");
        }

        parametersOutput[field] = value;
    }

    return parametersOutput;
}